

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O3

void __thiscall QPDFWriter::generateObjectStreams(QPDFWriter *this)

{
  long lVar1;
  int iVar2;
  Object *pOVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong idx;
  element_type *peVar7;
  int iVar8;
  ulong uVar9;
  QPDFObjGen *item;
  ulong uVar10;
  pointer pQVar11;
  vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> eligible;
  QPDFObjectHandle QStack_58;
  vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> local_48;
  
  QPDF::getCompressibleObjVector
            (&local_48,
             ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pdf);
  uVar9 = ((long)local_48.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_48.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) + 99;
  uVar10 = uVar9 / 100;
  initializeTables(this,uVar10 * 2);
  if (uVar9 < 100) {
    (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->obj).
    streams_empty = true;
  }
  else {
    uVar5 = (long)local_48.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_48.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    uVar9 = uVar5 / uVar10;
    QPDF::newIndirectNull((QPDF *)&QStack_58);
    iVar2 = QPDFObjectHandle::getObjectID(&QStack_58);
    if (QStack_58.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (QStack_58.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_48.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_48.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar6 = 0;
      pQVar11 = local_48.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        iVar8 = (int)uVar6;
        peVar7 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (uVar9 + (uVar10 * uVar9 < uVar5) == uVar6) {
          QPDF::newIndirectNull((QPDF *)&QStack_58);
          iVar2 = QPDFObjectHandle::getObjectID(&QStack_58);
          if (QStack_58.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (QStack_58.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          peVar7 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar8 = 0;
        }
        idx = (ulong)(*pQVar11).obj;
        lVar1 = *(long *)&(peVar7->obj).super_ObjTable<QPDFWriter::Object>.
                          super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                          super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                          ._M_impl;
        uVar6 = ((long)*(pointer *)
                        ((long)&(peVar7->obj).super_ObjTable<QPDFWriter::Object>.
                                super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                                .
                                super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                        + 8) - lVar1 >> 2) * -0x5555555555555555;
        if (uVar6 < idx || uVar6 - idx == 0) {
          pOVar3 = ObjTable<QPDFWriter::Object>::large_element
                             (&(peVar7->obj).super_ObjTable<QPDFWriter::Object>,idx);
          iVar4 = pQVar11->gen;
        }
        else {
          iVar4 = (*pQVar11).gen;
          pOVar3 = (Object *)(lVar1 + idx * 0xc);
        }
        pOVar3->object_stream = iVar2;
        pOVar3->gen = iVar4;
        uVar6 = (ulong)(iVar8 + 1);
        pQVar11 = pQVar11 + 1;
      } while (pQVar11 !=
               local_48.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
  }
  if (local_48.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
QPDFWriter::generateObjectStreams()
{
    // Basic strategy: make a list of objects that can go into an object stream.  Then figure out
    // how many object streams are needed so that we can distribute objects approximately evenly
    // without having any object stream exceed 100 members.  We don't have to worry about linearized
    // files here -- if the file is linearized, we take care of excluding things that aren't allowed
    // here later.

    // This code doesn't do anything with /Extends.

    std::vector<QPDFObjGen> eligible = QPDF::Writer::getCompressibleObjGens(m->pdf);
    size_t n_object_streams = (eligible.size() + 99U) / 100U;

    initializeTables(2U * n_object_streams);
    if (n_object_streams == 0) {
        m->obj.streams_empty = true;
        return;
    }
    size_t n_per = eligible.size() / n_object_streams;
    if (n_per * n_object_streams < eligible.size()) {
        ++n_per;
    }
    unsigned int n = 0;
    int cur_ostream = m->pdf.newIndirectNull().getObjectID();
    for (auto const& item: eligible) {
        if (n == n_per) {
            QTC::TC("qpdf", "QPDFWriter generate >1 ostream");
            n = 0;
            // Construct a new null object as the "original" object stream.  The rest of the code
            // knows that this means we're creating the object stream from scratch.
            cur_ostream = m->pdf.newIndirectNull().getObjectID();
        }
        auto& obj = m->obj[item];
        obj.object_stream = cur_ostream;
        obj.gen = item.getGen();
        ++n;
    }
}